

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Transmitter_PDU::operator==(Transmitter_PDU *this,Transmitter_PDU *Value)

{
  KBOOL KVar1;
  
  KVar1 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::RadioEntityType::operator!=
                          (&this->m_RadioEntityType,&Value->m_RadioEntityType), !KVar1)) &&
      (this->m_ui8TransmitterState == Value->m_ui8TransmitterState)) &&
     (((this->m_ui8InputSource == Value->m_ui8InputSource &&
       (KVar1 = DATA_TYPE::AntennaLocation::operator!=
                          (&this->m_AntennaLocation,&Value->m_AntennaLocation), !KVar1)) &&
      ((this->m_ui16AntennaPatternType == Value->m_ui16AntennaPatternType &&
       ((this->m_ui16AntennaPatternLength == Value->m_ui16AntennaPatternLength &&
        (this->m_ui64Freq == Value->m_ui64Freq)))))))) {
    if (((float)this->m_f32TransmitFreqBW == (float)Value->m_f32TransmitFreqBW) &&
       (!NAN((float)this->m_f32TransmitFreqBW) && !NAN((float)Value->m_f32TransmitFreqBW))) {
      if (((((float)this->m_f32Power == (float)Value->m_f32Power) &&
           (!NAN((float)this->m_f32Power) && !NAN((float)Value->m_f32Power))) &&
          (KVar1 = DATA_TYPE::ModulationType::operator!=
                             (&this->m_ModulationType,&Value->m_ModulationType), !KVar1)) &&
         (KVar1 = DATA_TYPE::CryptoSystem::operator!=(&this->m_CryptoSystem,&Value->m_CryptoSystem),
         !KVar1)) {
        return this->m_ui8LengthOfModulationParam == Value->m_ui8LengthOfModulationParam;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Transmitter_PDU::operator == ( const Transmitter_PDU & Value ) const
{
    if( Radio_Communications_Header::operator !=( Value ) )                           return false;
    if( m_RadioEntityType                     != Value.m_RadioEntityType )            return false;
    if( m_ui8TransmitterState                 != Value.m_ui8TransmitterState )        return false;
    if( m_ui8InputSource                      != Value.m_ui8InputSource )             return false;
    if( m_AntennaLocation                     != Value.m_AntennaLocation )            return false;
    if( m_ui16AntennaPatternType              != Value.m_ui16AntennaPatternType )     return false;
    if( m_ui16AntennaPatternLength            != Value.m_ui16AntennaPatternLength )   return false;
    if( m_ui64Freq                            != Value.m_ui64Freq )                   return false;
    if( m_f32TransmitFreqBW                   != Value.m_f32TransmitFreqBW )          return false;
    if( m_f32Power                            != Value.m_f32Power )                   return false;
    if( m_ModulationType                      != Value.m_ModulationType )             return false;
    if( m_CryptoSystem                        != Value.m_CryptoSystem )               return false;
    if( m_ui8LengthOfModulationParam          != Value.m_ui8LengthOfModulationParam ) return false;
    return true;
}